

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O2

uint16_t __thiscall xray_re::_vector3<float>::compress(_vector3<float> *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined4 in_EAX;
  undefined4 extraout_EAX;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  
  if (initialized == '\0') {
    initialize();
    in_EAX = extraout_EAX;
  }
  uVar1 = *(ulong *)&this->field_0;
  fVar8 = (float)(uVar1 >> 0x20);
  auVar9._0_8_ = uVar1 ^ 0x8000000080000000;
  auVar9._8_4_ = 0x80000000;
  auVar9._12_4_ = 0x80000000;
  iVar6 = -(uint)((float)uVar1 < -(float)uVar1);
  iVar7 = -(uint)(fVar8 < -fVar8);
  auVar2._4_4_ = iVar6;
  auVar2._0_4_ = iVar6;
  auVar2._8_4_ = iVar7;
  auVar2._12_4_ = iVar7;
  uVar3 = movmskpd(in_EAX,auVar2);
  uVar4 = (short)uVar3 * -0x8000;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10 = maxps(auVar9,auVar10);
  uVar5 = uVar4 + 0x4000;
  if ((uVar3 & 2) == 0) {
    uVar5 = uVar4;
  }
  fVar8 = (this->field_0).field_0.z;
  fVar11 = -fVar8;
  uVar4 = uVar5 + 0x2000;
  if (-fVar8 <= fVar8) {
    fVar11 = fVar8;
    uVar4 = uVar5;
  }
  fVar11 = 126.0 / (auVar10._0_4_ + auVar10._4_4_ + fVar11);
  fVar8 = floorf(auVar10._0_4_ * fVar11);
  iVar7 = (int)fVar8;
  fVar8 = floorf(fVar11 * auVar10._4_4_);
  uVar5 = 0x7f - (ushort)(int)fVar8;
  iVar6 = 0x7f - iVar7;
  if (iVar7 < 0x40) {
    uVar5 = (ushort)(int)fVar8;
    iVar6 = iVar7;
  }
  return uVar5 | uVar4 | (ushort)(iVar6 << 7);
}

Assistant:

uint16_t _vector3<float>::compress() const
{
	if (!initialized)
		initialize();

	uint16_t s = 0;
	float _x, _y, _z;
	if ((_x = x) < 0) {
		_x = -_x;
		s |= 0x8000;
	}
	if ((_y = y) < 0) {
		_y = -_y;
		s |= 0x4000;
	}
	if ((_z = z) < 0) {
		_z = -_z;
		s |= 0x2000;
	}
	float adj = 126.f/(_x + _y + _z);
	int u = int(std::floor(_x * adj));
	int v = int(std::floor(_y * adj));
	if (u > 63) {
		u = 127 - u;
		v = 127 - v;
	}
	return (u << 7) | v | s;
}